

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::Datum::SharedCtor(Datum *this)

{
  string *default_value;
  Datum *this_local;
  
  this->_cached_size_ = 0;
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->data_,default_value);
  memset(&this->channels_,0,0x11);
  return;
}

Assistant:

void Datum::SharedCtor() {
  _cached_size_ = 0;
  data_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&channels_, 0, reinterpret_cast<char*>(&encoded_) -
    reinterpret_cast<char*>(&channels_) + sizeof(encoded_));
}